

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocking_queue.h
# Opt level: O0

iterator * __thiscall
bidfx_public_api::tools::BlockingQueue<int>::Poll
          (iterator *__return_storage_ptr__,BlockingQueue<int> *this,milliseconds duration)

{
  bool bVar1;
  bool local_91;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_70;
  rep local_68;
  duration<long,_std::ratio<1L,_1000000000L>_> local_60 [3];
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_48;
  duration<long,_std::ratio<1L,_1000000000L>_> local_40;
  nanoseconds elapsed;
  unique_lock<std::mutex> lock;
  time_point start;
  BlockingQueue<int> *this_local;
  milliseconds duration_local;
  
  this_local = (BlockingQueue<int> *)duration.__r;
  duration_local.__r = (rep)__return_storage_ptr__;
  lock._8_8_ = std::chrono::_V2::steady_clock::now();
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&elapsed,&this->mutex_);
  local_48.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_40.__r = (rep)std::chrono::operator-
                                (&local_48,
                                 (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&lock._M_owns);
  while( true ) {
    bVar1 = std::deque<int,_std::allocator<int>_>::empty(&this->queue_);
    local_91 = false;
    if (bVar1) {
      local_91 = std::chrono::operator<
                           (&local_40,(duration<long,_std::ratio<1L,_1000L>_> *)&this_local);
    }
    if (local_91 == false) break;
    local_60[0].__r =
         (rep)std::chrono::operator-
                        ((duration<long,_std::ratio<1L,_1000L>_> *)&this_local,&local_40);
    std::condition_variable::wait_for<long,std::ratio<1l,1000000000l>>
              (&this->condition_,(unique_lock<std::mutex> *)&elapsed,local_60);
    local_70.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    local_68 = (rep)std::chrono::operator-
                              (&local_70,
                               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)&lock._M_owns);
    local_40.__r = local_68;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&elapsed);
  Pop(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

typename std::deque<T>::iterator Poll(std::chrono::milliseconds duration)
    {
        {
            std::chrono::steady_clock::time_point start = std::chrono::steady_clock::now();
            std::unique_lock<std::mutex> lock(mutex_);
            std::chrono::nanoseconds elapsed = std::chrono::steady_clock::now() - start;
            while (queue_.empty() && elapsed < duration)
            {
                condition_.wait_for(lock, duration - elapsed);
                elapsed = std::chrono::steady_clock::now() - start;
            }
        }
        return Pop();
    }